

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

SessionSpecial * pty_get_specials(Backend *be)

{
  return (SessionSpecial *)0x0;
}

Assistant:

static const SessionSpecial *pty_get_specials(Backend *be)
{
    /* Pty *pty = container_of(be, Pty, backend); */
    /*
     * Hmm. When I get round to having this actually usable, it
     * might be quite nice to have the ability to deliver a few
     * well chosen signals to the child process - SIGINT, SIGTERM,
     * SIGKILL at least.
     */
    return NULL;
}